

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashutil.h
# Opt level: O3

void writeKeys<unsigned_long>
               (string *str,vector<unsigned_long,_std::allocator<unsigned_long>_> *keys,
               string *key_type,vector<int,_std::allocator<int>_> *mapping,size_t n)

{
  int *piVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  char cVar10;
  ulong uVar11;
  int *piVar12;
  string __str;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = keys;
  std::operator+(&local_50,"    static constexpr std::array<",key_type);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_68 = *puVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar6;
    local_78 = (ulong *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar11 = n + 1;
  cVar10 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (uVar7 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0010b7b3;
      }
      if (uVar7 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0010b7b3;
      }
      if (uVar7 < 10000) goto LAB_0010b7b3;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_0010b7b3:
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,uVar11);
  uVar11 = CONCAT44(uStack_8c,local_90) + local_70;
  uVar7 = 0xf;
  if (local_78 != &local_68) {
    uVar7 = local_68;
  }
  if (uVar7 < uVar11) {
    uVar7 = 0xf;
    if (local_98 != local_88) {
      uVar7 = local_88[0];
    }
    if (uVar11 <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      goto LAB_0010b835;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
LAB_0010b835:
  local_d8 = &local_c8;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c8 = *plVar4;
    uStack_c0 = puVar5[3];
  }
  else {
    local_c8 = *plVar4;
    local_d8 = (long *)*puVar5;
  }
  local_d0 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8 = &local_a8;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a8 = *plVar8;
    lStack_a0 = plVar4[3];
  }
  else {
    local_a8 = *plVar8;
    local_b8 = (long *)*plVar4;
  }
  local_b0 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)str,(ulong)local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  piVar12 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar1 = (mapping->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar12 != piVar1) {
    uVar11 = 0;
    do {
      if ((uVar11 != 0) && (uVar11 == (uVar11 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)str);
      }
      if ((long)*piVar12 == -1) {
        std::__cxx11::string::append((char *)str);
      }
      else {
        uVar7 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start[*piVar12];
        cVar10 = '\x01';
        if (9 < uVar7) {
          uVar9 = uVar7;
          cVar3 = '\x04';
          do {
            cVar10 = cVar3;
            if (uVar9 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_0010ba3c;
            }
            if (uVar9 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_0010ba3c;
            }
            if (uVar9 < 10000) goto LAB_0010ba3c;
            bVar2 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            cVar3 = cVar10 + '\x04';
          } while (bVar2);
          cVar10 = cVar10 + '\x01';
        }
LAB_0010ba3c:
        local_d8 = &local_c8;
        std::__cxx11::string::_M_construct((ulong)&local_d8,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d8,(uint)local_d0,uVar7);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d8);
        plVar8 = plVar4 + 2;
        if ((long *)*plVar4 == plVar8) {
          local_a8 = *plVar8;
          lStack_a0 = plVar4[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar8;
          local_b8 = (long *)*plVar4;
        }
        local_b0 = plVar4[1];
        *plVar4 = (long)plVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)str,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
      }
      uVar11 = uVar11 + 1;
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar1);
  }
  std::__cxx11::string::append((char *)str);
  return;
}

Assistant:

void writeKeys(std::string& str,
               const std::vector<KeyType>& keys,
               std::string key_type,
               const std::vector<int>& mapping,
               size_t n){
    str += "    static constexpr std::array<" + key_type + ", " + std::to_string(n+1) + "> keys {\n        ";

    size_t i = 0;
    for(const int& val : mapping){
        if(i && i%entries_per_row==0) str += "\n        ";
        i++;
        if(val == -1) str += "0,";
        else    str += std::to_string(keys[val]) + ",";
    }
    str += "\n    };\n";
}